

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

bool spvtools::CFA<spvtools::opt::DominatorTreeNode>::FindInWorkList
               (vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
                *work_list,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  reference pbVar3;
  block_info *b;
  const_iterator __end0;
  const_iterator __begin0;
  vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
  *__range2;
  uint32_t id_local;
  vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
  *work_list_local;
  
  __end0 = std::
           vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
           ::begin(work_list);
  b = (block_info *)
      std::
      vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>
      ::end(work_list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info_*,_std::vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>_>
                                *)&b);
    if (!bVar1) {
      return false;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info_*,_std::vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>_>
             ::operator*(&__end0);
    uVar2 = opt::DominatorTreeNode::id(pbVar3->block);
    if (uVar2 == id) break;
    __gnu_cxx::
    __normal_iterator<const_spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info_*,_std::vector<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info,_std::allocator<spvtools::CFA<spvtools::opt::DominatorTreeNode>::block_info>_>_>
    ::operator++(&__end0);
  }
  return true;
}

Assistant:

bool CFA<BB>::FindInWorkList(const std::vector<block_info>& work_list,
                             uint32_t id) {
  for (const auto& b : work_list) {
    if (b.block->id() == id) return true;
  }
  return false;
}